

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

bool __thiscall Matrix::lu(Matrix *this,int32_t *idx,FLOAT *d,FLOAT eps)

{
  uint uVar1;
  uint uVar2;
  FLOAT **ppFVar3;
  FLOAT **ppFVar4;
  FLOAT *pFVar5;
  void *__ptr;
  ostream *poVar6;
  ulong uVar7;
  long lVar8;
  FLOAT *pFVar9;
  FLOAT *pFVar10;
  int iVar11;
  FLOAT *__size;
  long lVar12;
  FLOAT *pFVar13;
  FLOAT *pFVar14;
  ulong uVar15;
  double dVar16;
  FLOAT FVar17;
  double dVar18;
  
  uVar1 = this->m;
  pFVar9 = (FLOAT *)(ulong)uVar1;
  if (uVar1 != this->n) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "ERROR: Trying to LU decompose a matrix of size (");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,this->m);
    poVar6 = std::operator<<(poVar6,"x");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,this->n);
    poVar6 = std::operator<<(poVar6,")");
    std::endl<char,std::char_traits<char>>(poVar6);
    exit(0);
  }
  __size = (FLOAT *)((long)(int)uVar1 * 8);
  __ptr = malloc((size_t)__size);
  *d = 1.0;
  uVar15 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  ppFVar3 = this->val;
  for (; uVar15 != uVar7; uVar15 = uVar15 + 1) {
    dVar16 = 0.0;
    for (pFVar10 = (FLOAT *)0x0; pFVar9 != pFVar10; pFVar10 = (FLOAT *)((long)pFVar10 + 1)) {
      __size = ppFVar3[uVar15];
      dVar18 = ABS(__size[(long)pFVar10]);
      if (ABS(__size[(long)pFVar10]) <= dVar16) {
        dVar18 = dVar16;
      }
      dVar16 = dVar18;
    }
    if ((dVar16 == 0.0) && (!NAN(dVar16))) goto LAB_00103ed8;
    *(double *)((long)__ptr + uVar15 * 8) = 1.0 / dVar16;
  }
  lVar8 = 1;
  for (pFVar10 = (FLOAT *)0x0; (long)pFVar10 < (long)(int)pFVar9;
      pFVar10 = (FLOAT *)((long)pFVar10 + 1)) {
    ppFVar4 = this->val;
    for (pFVar13 = (FLOAT *)0x0; pFVar13 != pFVar10; pFVar13 = (FLOAT *)((long)pFVar13 + 1)) {
      pFVar5 = ppFVar4[(long)pFVar13];
      FVar17 = pFVar5[(long)pFVar10];
      for (pFVar14 = (FLOAT *)0x0; pFVar13 != pFVar14; pFVar14 = (FLOAT *)((long)pFVar14 + 1)) {
        FVar17 = FVar17 - pFVar5[(long)pFVar14] * ppFVar4[(long)pFVar14][(long)pFVar10];
      }
      pFVar5[(long)pFVar10] = FVar17;
    }
    ppFVar4 = this->val;
    dVar16 = 0.0;
    for (pFVar13 = pFVar10; pFVar13 != pFVar9; pFVar13 = (FLOAT *)((long)pFVar13 + 1)) {
      pFVar5 = ppFVar4[(long)pFVar13];
      FVar17 = pFVar5[(long)pFVar10];
      for (pFVar14 = (FLOAT *)0x0; pFVar10 != pFVar14; pFVar14 = (FLOAT *)((long)pFVar14 + 1)) {
        FVar17 = FVar17 - pFVar5[(long)pFVar14] * ppFVar4[(long)pFVar14][(long)pFVar10];
      }
      pFVar5[(long)pFVar10] = FVar17;
      dVar18 = ABS(FVar17) * *(double *)((long)__ptr + (long)pFVar13 * 8);
      if (dVar16 <= dVar18) {
        __size = pFVar13;
      }
      __size = (FLOAT *)((ulong)__size & 0xffffffff);
      dVar16 = (double)(-(ulong)(dVar18 < dVar16) & (ulong)dVar16 |
                       ~-(ulong)(dVar18 < dVar16) & (ulong)dVar18);
    }
    iVar11 = (int)__size;
    if (pFVar10 != (FLOAT *)((ulong)__size & 0xffffffff)) {
      ppFVar4 = this->val;
      for (pFVar13 = (FLOAT *)0x0; pFVar9 != pFVar13; pFVar13 = (FLOAT *)((long)pFVar13 + 1)) {
        pFVar5 = ppFVar4[iVar11];
        FVar17 = pFVar5[(long)pFVar13];
        pFVar14 = ppFVar4[(long)pFVar10];
        pFVar5[(long)pFVar13] = pFVar14[(long)pFVar13];
        pFVar14[(long)pFVar13] = FVar17;
      }
      *d = -*d;
      *(undefined8 *)((long)__ptr + (long)iVar11 * 8) =
           *(undefined8 *)((long)__ptr + (long)pFVar10 * 8);
    }
    idx[(long)pFVar10] = iVar11;
    uVar2 = this->n;
    pFVar9 = (FLOAT *)(ulong)uVar2;
    if (pFVar10 != (FLOAT *)(ulong)(uVar2 - 1)) {
      dVar16 = ppFVar3[(long)pFVar10][(long)pFVar10];
      for (lVar12 = lVar8; (int)lVar12 < (int)uVar2; lVar12 = lVar12 + 1) {
        ppFVar3[lVar12][(long)pFVar10] = ppFVar3[lVar12][(long)pFVar10] * (1.0 / dVar16);
      }
    }
    lVar8 = lVar8 + 1;
  }
LAB_00103ed8:
  free(__ptr);
  return (long)(int)uVar1 <= (long)uVar15;
}

Assistant:

bool Matrix::lu(int32_t *idx, FLOAT &d, FLOAT eps) {
  
  if (m != n) {
    cerr << "ERROR: Trying to LU decompose a matrix of size (" << m << "x" << n << ")" << endl;
    exit(0);
  }
  
  int32_t i,imax,j,k;
  FLOAT   big,dum,sum,temp;
  FLOAT* vv = (FLOAT*)malloc(n*sizeof(FLOAT)); // vv stores the implicit scaling of each row.
  d = 1.0;
  for (i=0; i<n; i++) { // Loop over rows to get the implicit scaling information.
    big = 0.0;
    for (j=0; j<n; j++)
      if ((temp=fabs(val[i][j]))>big)
        big = temp;
    if (big == 0.0) { // No nonzero largest element.
      free(vv);
      return false;
    }
    vv[i] = 1.0/big; // Save the scaling.
  }
  for (j=0; j<n; j++) { // This is the loop over columns of Crout’s method.
    for (i=0; i<j; i++) { // This is equation (2.3.12) except for i = j.
      sum = val[i][j];
      for (k=0; k<i; k++)
        sum -= val[i][k]*val[k][j];
      val[i][j] = sum;
    }
    big = 0.0; // Initialize the search for largest pivot element.
    for (i=j; i<n; i++) {
      sum = val[i][j];
      for (k=0; k<j; k++)
        sum -= val[i][k]*val[k][j];
      val[i][j] = sum;
      if ( (dum=vv[i]*fabs(sum))>=big) {
        big  = dum;
        imax = i;
      }
    }
    if (j!=imax) { // Do we need to interchange rows?
      for (k=0; k<n; k++) { // Yes, do so...
        dum          = val[imax][k];
        val[imax][k] = val[j][k];
        val[j][k]    = dum;
      }
      d = -d;     // ...and change the parity of d.
      vv[imax]=vv[j]; // Also interchange the scale factor.
    }
    idx[j] = imax;
    if (j!=n-1) { // Now, finally, divide by the pivot element.
      dum = 1.0/val[j][j];
      for (i=j+1; i<n; i++)
        val[i][j] *= dum;
    }
  } // Go back for the next column in the reduction.
  
  // success
  free(vv);
  return true;
}